

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O2

void popupnewone_proc(Am_Object param_1)

{
  ushort uVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  uint uVar5;
  Am_Object new_pop;
  Am_Value v;
  Am_Object local_10;
  
  Am_Object::Create((char *)&v);
  uVar1 = Am_Object::Set((ushort)&v,100,(ulong)(window_count * 10 + 100));
  uVar1 = Am_Object::Set(uVar1,0x65,(ulong)(window_count * 10 + 100));
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,true,0);
  Am_Object::Am_Object(&new_pop,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&v);
  uVar5 = window_count % 4 - 1;
  if (uVar5 < 3) {
    pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)(&PTR_Am_Yellow_00112b50)[uVar5]);
    Am_Object::Set((ushort)&new_pop,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  }
  window_count = window_count + 1;
  poVar4 = std::operator<<((ostream *)&std::cout,"Popping up window ");
  poVar4 = (ostream *)operator<<(poVar4,&new_pop);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_10,&new_pop);
  Am_Pop_Up_Window_And_Wait((Am_Object_Data *)&local_10,&v,false);
  Am_Object::~Am_Object(&local_10);
  poVar4 = std::operator<<((ostream *)&std::cout,"Popup ");
  poVar4 = (ostream *)operator<<(poVar4,&new_pop);
  poVar4 = std::operator<<(poVar4," returned ");
  poVar4 = (ostream *)operator<<(poVar4,&v);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&new_pop);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, popupnewone, (Am_Object /*self*/))
{
  Am_Object new_pop = pop_up_window.Create()
                          .Set(Am_LEFT, 100 + window_count * 10)
                          .Set(Am_TOP, 100 + window_count * 10)
                          .Set(Am_VISIBLE, false);
  if (window_count % 4 == 1)
    new_pop.Set(Am_FILL_STYLE, Am_Yellow);
  else if (window_count % 4 == 2)
    new_pop.Set(Am_FILL_STYLE, Am_Blue);
  else if (window_count % 4 == 3)
    new_pop.Set(Am_FILL_STYLE, Am_Green);
  window_count++;
  cout << "Popping up window " << new_pop << endl << flush;
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(new_pop, v, false);
  cout << "Popup " << new_pop << " returned " << v << endl << flush;
}